

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandleCoberturaCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  size_type sVar6;
  string local_3e8 [32];
  undefined1 local_3c8 [8];
  ostringstream cmCTestLog_msg_1;
  string local_250 [32];
  undefined1 local_230 [8];
  ostringstream cmCTestLog_msg;
  string local_b8;
  undefined1 local_88 [8];
  string coverageXMLFile;
  cmParseCoberturaCoverage cov;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  cmParseCoberturaCoverage::cmParseCoberturaCoverage
            ((cmParseCoberturaCoverage *)((long)&coverageXMLFile.field_2 + 8),cont,
             (this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::string((string *)local_88);
  bVar2 = cmsys::SystemTools::GetEnv("COBERTURADIR",(string *)local_88);
  if ((!bVar2) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
    cmCTest::GetBinaryDir_abi_cxx11_(&local_b8,(this->super_cmCTestGenericHandler).CTest);
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::operator+=((string *)local_88,"/coverage.xml");
  bVar2 = cmsys::SystemTools::FileExists((string *)local_88);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    poVar4 = std::operator<<((ostream *)local_230,"Parsing Cobertura XML file: ");
    poVar4 = std::operator<<(poVar4,(string *)local_88);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x2e2,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_250);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmParseCoberturaCoverage::ReadCoverageXML
              ((cmParseCoberturaCoverage *)((long)&coverageXMLFile.field_2 + 8),pcVar5);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
    poVar4 = std::operator<<((ostream *)local_3c8," Cannot find Cobertura XML file: ");
    poVar4 = std::operator<<(poVar4,(string *)local_88);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x2e8,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
  }
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::size(&cont->TotalCoverage);
  std::__cxx11::string::~string((string *)local_88);
  cmParseCoberturaCoverage::~cmParseCoberturaCoverage
            ((cmParseCoberturaCoverage *)((long)&coverageXMLFile.field_2 + 8));
  return (int)sVar6;
}

Assistant:

int cmCTestCoverageHandler::HandleCoberturaCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmParseCoberturaCoverage cov(*cont, this->CTest);

  // Assume the coverage.xml is in the binary directory
  // check for the COBERTURADIR environment variable,
  // if it doesn't exist or is empty, assume the
  // binary directory is used.
  std::string coverageXMLFile;
  if (!cmSystemTools::GetEnv("COBERTURADIR", coverageXMLFile) ||
      coverageXMLFile.empty()) {
    coverageXMLFile = this->CTest->GetBinaryDir();
  }
  // build the find file string with the directory from above
  coverageXMLFile += "/coverage.xml";

  if (cmSystemTools::FileExists(coverageXMLFile)) {
    // If file exists, parse it
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Parsing Cobertura XML file: " << coverageXMLFile
                                                      << std::endl,
                       this->Quiet);
    cov.ReadCoverageXML(coverageXMLFile.c_str());
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find Cobertura XML file: " << coverageXMLFile
                                                           << std::endl,
                       this->Quiet);
  }
  return static_cast<int>(cont->TotalCoverage.size());
}